

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixEigenExtensions.h
# Opt level: O0

void __thiscall
Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::ArchiveIN
          (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *this,ChArchiveIn *marchive)

{
  size_t sVar1;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *pPVar2;
  Index IVar3;
  Index IVar4;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *this_00;
  Scalar *t;
  ChNameValue<double> local_a8;
  ulong local_90;
  size_t i;
  char idname [20];
  size_t tot_elements;
  ChNameValue<unsigned_long> local_40;
  unsigned_long local_28;
  size_t m_col;
  size_t m_row;
  ChArchiveIn *marchive_local;
  MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *this_local;
  
  m_row = (size_t)marchive;
  marchive_local = (ChArchiveIn *)this;
  chrono::ChArchiveIn::VersionRead<chrono::ChMatrix_dense_version_tag>(marchive);
  sVar1 = m_row;
  chrono::make_ChNameValue<unsigned_long>(&local_40,"rows",&m_col,'\0');
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)sVar1,&local_40);
  chrono::ChNameValue<unsigned_long>::~ChNameValue(&local_40);
  sVar1 = m_row;
  chrono::make_ChNameValue<unsigned_long>
            ((ChNameValue<unsigned_long> *)&tot_elements,"columns",&local_28,'\0');
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)sVar1,(ChNameValue<unsigned_long> *)&tot_elements);
  chrono::ChNameValue<unsigned_long>::~ChNameValue((ChNameValue<unsigned_long> *)&tot_elements);
  pPVar2 = &EigenBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::derived
                      ((EigenBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)this)->
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>;
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize(pPVar2,m_col,local_28);
  pPVar2 = &EigenBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::derived
                      ((EigenBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)this)->
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>;
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::rows(pPVar2);
  pPVar2 = &EigenBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::derived
                      ((EigenBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)this)->
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>;
  IVar4 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::cols(pPVar2);
  register0x00000000 = IVar3 * IVar4;
  (**(code **)(*(long *)m_row + 0x70))(m_row,"data",idname + 0x10);
  for (local_90 = 0; local_90 < stack0xffffffffffffff90; local_90 = local_90 + 1) {
    sprintf((char *)&i,"%lu",local_90);
    sVar1 = m_row;
    this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
              EigenBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::derived
                        ((EigenBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)this);
    t = DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()(this_00,local_90);
    chrono::make_ChNameValue<double>(&local_a8,"derived()((Eigen::Index)i)",t,(char *)&i,'\0');
    chrono::ChArchiveIn::operator>>((ChArchiveIn *)sVar1,&local_a8);
    chrono::ChNameValue<double>::~ChNameValue(&local_a8);
    (**(code **)(*(long *)m_row + 0x78))(m_row,"data");
  }
  (**(code **)(*(long *)m_row + 0x80))(m_row,"data");
  return;
}

Assistant:

void ArchiveIN(chrono::ChArchiveIn& marchive) {
    // suggested: use versioning
    /*int version =*/ marchive.VersionRead<chrono::ChMatrix_dense_version_tag>(); // btw use the ChMatrixDynamic version tag also for all other templates.
	
    // stream in all member data
    size_t m_row; 
	size_t m_col;
    marchive >> chrono::make_ChNameValue("rows", m_row);
    marchive >> chrono::make_ChNameValue("columns", m_col);
	
    derived().resize(m_row, m_col);

    // custom input of matrix data as array
    size_t tot_elements = derived().rows() * derived().cols();
    marchive.in_array_pre("data", tot_elements);
	char idname[20]; // only for xml, xml serialization needs unique element name
    for (size_t i = 0; i < tot_elements; i++) {
		sprintf(idname, "%lu", (unsigned long)i);
        marchive >> chrono::CHNVP(derived()((Eigen::Index)i), idname);
        marchive.in_array_between("data");
    }
    marchive.in_array_end("data");
}